

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O2

int lj_cf_setfenv(lua_State *L)

{
  uint uVar1;
  TValue *pTVar2;
  int32_t level;
  GCobj *v;
  cTValue *pcVar3;
  GCobj *o;
  int local_1c;
  
  v = (GCobj *)lj_lib_checktab(L,2);
  pcVar3 = L->base;
  if ((L->top <= pcVar3) || ((pcVar3->field_2).it != 0xfffffff7)) {
    level = lj_lib_checkint(L,1);
    if (level == 0) {
      (L->env).gcptr32 = (uint32_t)v;
      return 0;
    }
    pcVar3 = lj_debug_frame(L,level,&local_1c);
    if (pcVar3 == (cTValue *)0x0) {
      lj_err_arg(L,1,LJ_ERR_INVLVL);
    }
  }
  uVar1 = (pcVar3->u32).lo;
  o = (GCobj *)(ulong)uVar1;
  if ((o->gch).unused1 == '\0') {
    (o->str).hash = (uint32_t)v;
    if ((((v->gch).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
      lj_gc_barrierf((global_State *)(ulong)(L->glref).ptr32,o,v);
    }
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    (pTVar2->u32).lo = uVar1;
    (pTVar2->field_2).it = 0xfffffff7;
    return 1;
  }
  lj_err_caller(L,LJ_ERR_SETFENV);
}

Assistant:

LJLIB_CF(setfenv)
{
  GCfunc *fn;
  GCtab *t = lj_lib_checktab(L, 2);
  cTValue *o = L->base;
  if (!(o < L->top && tvisfunc(o))) {
    int level = lj_lib_checkint(L, 1);
    if (level == 0) {
      /* NOBARRIER: A thread (i.e. L) is never black. */
      setgcref(L->env, obj2gco(t));
      return 0;
    }
    o = lj_debug_frame(L, level, &level);
    if (o == NULL)
      lj_err_arg(L, 1, LJ_ERR_INVLVL);
  }
  fn = &gcval(o)->fn;
  if (!isluafunc(fn))
    lj_err_caller(L, LJ_ERR_SETFENV);
  setgcref(fn->l.env, obj2gco(t));
  lj_gc_objbarrier(L, obj2gco(fn), t);
  setfuncV(L, L->top++, fn);
  return 1;
}